

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ConversionError::ConversionError(ConversionError *this,string *msg)

{
  string *in_RSI;
  string *in_RDI;
  ConversionError *unaff_retaddr;
  string local_68 [55];
  allocator local_31;
  string local_30 [28];
  ExitCodes in_stack_ffffffffffffffec;
  string *msg_00;
  
  msg_00 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"ConversionError",&local_31);
  ::std::__cxx11::string::string(local_68,(string *)in_RSI);
  ConversionError(unaff_retaddr,in_RDI,msg_00,in_stack_ffffffffffffffec);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

ConversionError(std::string member, std::string name)
        : ConversionError("The value " + member + " is not an allowed value for " + name) {}